

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall tinyusdz::Attribute::get_value<tinyusdz::value::point3f>(Attribute *this,point3f *v)

{
  value_type *pvVar1;
  optional<tinyusdz::value::point3f> local_40;
  undefined1 local_30 [8];
  optional<tinyusdz::value::point3f> ret;
  point3f *v_local;
  Attribute *this_local;
  
  if (v == (point3f *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    ret.contained._4_8_ = v;
    primvar::PrimVar::get_value<tinyusdz::value::point3f>(&local_40,&this->_var);
    nonstd::optional_lite::optional<tinyusdz::value::point3f>::optional<tinyusdz::value::point3f,_0>
              ((optional<tinyusdz::value::point3f> *)local_30,&local_40);
    nonstd::optional_lite::optional<tinyusdz::value::point3f>::~optional(&local_40);
    this_local._7_1_ = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_30);
    if (this_local._7_1_) {
      pvVar1 = nonstd::optional_lite::optional<tinyusdz::value::point3f>::value
                         ((optional<tinyusdz::value::point3f> *)local_30);
      *(undefined8 *)ret.contained._4_8_ = *(undefined8 *)pvVar1;
      *(float *)(ret.contained._4_8_ + 8) = pvVar1->z;
    }
    nonstd::optional_lite::optional<tinyusdz::value::point3f>::~optional
              ((optional<tinyusdz::value::point3f> *)local_30);
  }
  return this_local._7_1_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }